

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

void __thiscall Noise::setParameter(Noise *this,string *name,string *value)

{
  int iVar1;
  long lVar2;
  double d;
  stringstream param;
  undefined8 local_1a8;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::istream::_M_extract<double>((double *)local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    lVar2 = 0x90;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      lVar2 = 0x98;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        lVar2 = 0x80;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          Parametric::setParameter((Parametric *)this,name,value);
          goto LAB_0013adfd;
        }
        lVar2 = 0x88;
      }
    }
  }
  (**(code **)((long)(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                     _vptr_Parametric + lVar2))(local_1a8,this);
LAB_0013adfd:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void Noise::setParameter( const string& name, const string& value )
{
	stringstream param;
	double d;
	param << value;
	param >> d;
	
	if (name == "mean")
		setMean(d);
	else if (name == "std.dev.")
		setStdDev(d);
	else if (name == "weight")
		setWeight(d);
	else if (name == "rate")
		setRate(d);
	else
		StochasticVariable::setParameter(name, value);
}